

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  uint ttf_size;
  uint uVar3;
  uchar *ttf_data;
  ImFont *pIVar4;
  long lVar5;
  ulong uVar6;
  uchar *puVar7;
  byte bVar8;
  ImFontConfig *pIVar9;
  ushort *puVar10;
  ushort *puVar11;
  byte bVar12;
  ImFontConfig local_98;
  
  bVar12 = 0;
  ttf_size = stb_decompress_length((uchar *)compressed_ttf_data);
  pIVar2 = GImGui;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  ttf_data = (uchar *)(*(pIVar2->IO).MemAllocFn)((size_t)ttf_size);
  uVar3 = *compressed_ttf_data;
  if (((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) !=
       0x57bc0000) ||
     (uVar3 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar3 >> 0x18 != 0 || (uVar3 & 0xff0000) != 0) || (uVar3 & 0xff00) != 0) ||
     (uVar3 & 0xff) != 0)) {
LAB_00150cce:
    if (font_cfg_template == (ImFontConfig *)0x0) {
      local_98.FontData = (void *)0x0;
      local_98.FontDataSize = 0;
      local_98.FontNo = 0;
      local_98.SizePixels = 0.0;
      local_98.OversampleH = 3;
      local_98.OversampleV = 1;
      local_98.PixelSnapH = false;
      local_98.GlyphExtraSpacing.x = 0.0;
      local_98.GlyphExtraSpacing.y = 0.0;
      local_98.DstFont = (ImFont *)0x0;
      local_98.GlyphRanges = (ImWchar *)0x0;
      local_98.MergeMode = false;
      local_98.MergeGlyphCenterV = false;
      local_98.Name[0] = '\0';
      local_98.Name[1] = '\0';
      local_98.Name[2] = '\0';
      local_98.Name[3] = '\0';
      local_98.Name[4] = '\0';
      local_98.Name[5] = '\0';
      local_98.Name[6] = '\0';
      local_98.Name[7] = '\0';
      local_98.Name[8] = '\0';
      local_98.Name[9] = '\0';
      local_98.Name[10] = '\0';
      local_98.Name[0xb] = '\0';
      local_98.Name[0xc] = '\0';
      local_98.Name[0xd] = '\0';
      local_98.Name[0xe] = '\0';
      local_98.Name[0xf] = '\0';
      local_98.Name[0x10] = '\0';
      local_98.Name[0x11] = '\0';
      local_98.Name[0x12] = '\0';
      local_98.Name[0x13] = '\0';
      local_98.Name[0x14] = '\0';
      local_98.Name[0x15] = '\0';
      local_98.Name[0x16] = '\0';
      local_98.Name[0x17] = '\0';
      local_98.Name[0x18] = '\0';
      local_98.Name[0x19] = '\0';
      local_98.Name[0x1a] = '\0';
      local_98.Name[0x1b] = '\0';
      local_98.Name[0x1c] = '\0';
      local_98.Name[0x1d] = '\0';
      local_98.Name[0x1e] = '\0';
      local_98.Name[0x1f] = '\0';
    }
    else {
      pIVar9 = &local_98;
      for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
        pIVar9->FontData = font_cfg_template->FontData;
        font_cfg_template = (ImFontConfig *)((long)font_cfg_template + (ulong)bVar12 * -0x10 + 8);
        pIVar9 = (ImFontConfig *)((long)pIVar9 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      if (local_98.FontData != (void *)0x0) {
        __assert_fail("font_cfg.FontData == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                      ,0x4d0,
                      "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                     );
      }
    }
    local_98.FontDataOwnedByAtlas = true;
    pIVar4 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_98,glyph_ranges);
    return pIVar4;
  }
  uVar3 = stb_decompress_length((uchar *)compressed_ttf_data);
  stb__barrier3 = (uchar *)((ulong)(uint)compressed_ttf_size + (long)compressed_ttf_data);
  puVar7 = ttf_data + uVar3;
  puVar10 = (ushort *)((long)compressed_ttf_data + 0x10);
  stb__barrier2 = (uchar *)compressed_ttf_data;
  stb__barrier = puVar7;
  stb__barrier4 = ttf_data;
  stb__dout = ttf_data;
  do {
    bVar8 = (byte)*puVar10;
    uVar3 = (uint)bVar8;
    if (bVar8 < 0x20) {
      if (bVar8 < 0x18) {
        if (bVar8 < 0x10) {
          if (bVar8 < 8) {
            if (bVar8 != 4) {
              if (uVar3 == 6) {
                uVar6 = ~((ulong)*(byte *)((long)puVar10 + 3) |
                          (ulong)*(byte *)((long)puVar10 + 1) << 0x10 | (ulong)(byte)puVar10[1] << 8
                         );
                uVar3 = (uint)(byte)puVar10[2];
                goto LAB_00150b5e;
              }
              if (uVar3 == 7) {
                stb__lit((byte *)((long)puVar10 + 3),
                         (ushort)(*(ushort *)((long)puVar10 + 1) << 8 |
                                 *(ushort *)((long)puVar10 + 1) >> 8) + 1);
                uVar6 = (ulong)(ushort)(*(ushort *)((long)puVar10 + 1) << 8 |
                                       *(ushort *)((long)puVar10 + 1) >> 8);
                lVar5 = 4;
                goto LAB_00150c14;
              }
              goto LAB_00150ca7;
            }
            stb__match(stb__dout +
                       ~((ulong)*(byte *)((long)puVar10 + 3) |
                         (ulong)*(byte *)((long)puVar10 + 1) << 0x10 | (ulong)(byte)puVar10[1] << 8)
                       ,(ushort)(puVar10[2] << 8 | puVar10[2] >> 8) + 1);
            puVar11 = puVar10 + 3;
          }
          else {
            stb__lit((uchar *)(puVar10 + 1),
                     ((uint)bVar8 * 0x100 + (uint)*(byte *)((long)puVar10 + 1)) - 0x7ff);
            uVar6 = (ulong)(ushort)(*puVar10 << 8 | *puVar10 >> 8);
            lVar5 = -0x7fd;
LAB_00150c14:
            puVar11 = (ushort *)((long)puVar10 + uVar6 + lVar5);
            if (puVar11 == puVar10) {
              bVar8 = (byte)*puVar10;
LAB_00150ca7:
              if ((bVar8 != 5) || (*(byte *)((long)puVar10 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                              ,0x8e8,
                              "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              if (stb__dout != puVar7) {
                __assert_fail("stb__dout == output + olen",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                              ,0x8e2,
                              "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              goto LAB_00150cce;
            }
          }
        }
        else {
          uVar6 = -(ulong)(((uint)*(byte *)((long)puVar10 + 1) * 0x100 +
                           ((uint)(byte)puVar10[1] | (uint)bVar8 << 0x10)) - 0xfffff);
          uVar3 = (uint)(ushort)(*(ushort *)((long)puVar10 + 3) << 8 |
                                *(ushort *)((long)puVar10 + 3) >> 8);
LAB_00150b5e:
          stb__match(stb__dout + uVar6,uVar3 + 1);
          puVar11 = (ushort *)((long)puVar10 + 5);
        }
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar10 + 1) * 0x100 +
                            ((uint)(byte)puVar10[1] | (uint)bVar8 << 0x10)) - 0x17ffff),
                   *(byte *)((long)puVar10 + 3) + 1);
        puVar11 = puVar10 + 2;
      }
    }
    else if ((char)bVar8 < '\0') {
      stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar10 + 1),uVar3 - 0x7f);
      puVar11 = puVar10 + 1;
    }
    else {
      if (bVar8 < 0x40) {
        stb__lit((byte *)((long)puVar10 + 1),uVar3 - 0x1f);
        uVar6 = (ulong)(byte)*puVar10;
        lVar5 = -0x1e;
        goto LAB_00150c14;
      }
      stb__match(stb__dout +
                 -(ulong)(((uint)*(byte *)((long)puVar10 + 1) + (uint)bVar8 * 0x100) - 0x3fff),
                 (byte)puVar10[1] + 1);
      puVar11 = (ushort *)((long)puVar10 + 3);
    }
    puVar10 = puVar11;
    if (puVar7 < stb__dout) {
      __assert_fail("stb__dout <= output + olen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                    ,0x8ec,
                    "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)");
    }
  } while( true );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)ImGui::MemAlloc(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}